

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall cashew::ValueBuilder::makeUnary(ValueBuilder *this,IString op,Ref value)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  undefined1 local_30 [8];
  IString op_local;
  
  op_local.str._M_len = op.str._M_len;
  local_30 = (undefined1  [8])this;
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)&UNARY_PREFIX);
  pVVar2 = Value::push_back(RVar1.inst,r);
  RVar1 = makeRawString((IString *)local_30);
  pVVar2 = Value::push_back(pVVar2,RVar1);
  RVar1.inst = Value::push_back(pVVar2,(Value *)op.str._M_str);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeUnary(IString op, Ref value) {
    return &makeRawArray(3)
              ->push_back(makeRawString(UNARY_PREFIX))
              .push_back(makeRawString(op))
              .push_back(value);
  }